

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O1

void __thiscall ANN::save(ANN *this,string *filepath)

{
  long lVar1;
  ostream *poVar2;
  pointer pLVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  ofstream file;
  char local_231;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(string *)filepath,_S_out);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  local_231 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_231,1);
  pLVar3 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
      super__Vector_impl_data._M_finish != pLVar3) {
    uVar4 = 0;
    uVar6 = 1;
    do {
      Layer::get_nb_perceptrons(pLVar3 + uVar4);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      pLVar3 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pLVar3 >> 3) * 0x2e8ba2e8ba2e8ba3;
      bVar7 = uVar6 <= uVar4;
      lVar1 = uVar4 - uVar6;
      uVar4 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar7 && lVar1 != 0);
  }
  if ((long)(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
            super__Vector_impl_data._M_start != 0x58) {
    uVar5 = 1;
    uVar4 = 0;
    do {
      local_231 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_231,1);
      Matrix::print_weights
                (&(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4].m_weights,(ostream *)&local_230);
      Matrix::print_weights
                (&(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4].m_biases,(ostream *)&local_230);
      uVar4 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar4 < ((long)(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3 - 1U
            );
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void ANN::save(const std::string& filepath) const{
    uint n_perceptron=0, n_weights=0;
    std::ofstream file(filepath);

    file<<m_layers.size()<<'\n';
    for(uint i=0;i<m_layers.size();++i){
        file<<m_layers[i].get_nb_perceptrons()<<", ";
    }
    for(uint i=0;i<m_layers.size()-1;++i){
        file<<'\n';
        m_layers[i].weights().print_weights(file);
        m_layers[i].biases().print_weights(file);
    }

    file.close();
}